

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall ghc::filesystem::directory_iterator::impl::increment(impl *this,error_code *ec)

{
  dirent *pdVar1;
  int *piVar2;
  dirent *pdVar3;
  DIR *__dirp;
  error_code eVar4;
  
  __dirp = this->_dir;
  if (__dirp != (DIR *)0x0) {
    piVar2 = __errno_location();
    while( true ) {
      *piVar2 = 0;
      pdVar3 = readdir((DIR *)__dirp);
      this->_entry = (dirent *)pdVar3;
      if (pdVar3 == (dirent *)0x0) break;
      std::__cxx11::string::_M_assign((string *)&this->_dir_entry);
      path::append_name(&(this->_dir_entry)._path,this->_entry->d_name);
      copyToDirEntry(this);
      if (((ec->_M_value == 0xd) || (ec->_M_value == 1)) &&
         ((this->_options & skip_permission_denied) != none)) {
        std::error_code::clear(ec);
      }
      else {
        pdVar1 = this->_entry;
        if (pdVar1->d_name[0] != '.') {
          return;
        }
        if (pdVar1->d_name[1] != '\0') {
          if (pdVar1->d_name[1] != '.') {
            return;
          }
          if (pdVar1->d_name[2] != '\0') {
            return;
          }
        }
      }
      __dirp = this->_dir;
    }
    closedir((DIR *)this->_dir);
    this->_dir = (DIR *)0x0;
    (this->_dir_entry)._path._path._M_string_length = 0;
    *(this->_dir_entry)._path._path._M_dataplus._M_p = '\0';
    if (*piVar2 != 0) {
      eVar4 = detail::make_system_error(0);
      ec->_M_value = eVar4._M_value;
      ec->_M_cat = eVar4._M_cat;
    }
  }
  return;
}

Assistant:

void increment(std::error_code& ec)
    {
        if (_dir) {
            bool skip;
            do {
                skip = false;
                errno = 0;
                _entry = ::readdir(_dir);
                if (_entry) {
                    _dir_entry._path = _base;
                    _dir_entry._path.append_name(_entry->d_name);
                    copyToDirEntry();
                    if (ec && (ec.value() == EACCES || ec.value() == EPERM) && (_options & directory_options::skip_permission_denied) == directory_options::skip_permission_denied) {
                        ec.clear();
                        skip = true;
                    }
                }
                else {
                    ::closedir(_dir);
                    _dir = nullptr;
                    _dir_entry._path.clear();
                    if (errno) {
                        ec = detail::make_system_error();
                    }
                    break;
                }
            } while (skip || std::strcmp(_entry->d_name, ".") == 0 || std::strcmp(_entry->d_name, "..") == 0);
        }
    }